

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_node(REF_NODE ref_node,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,FILE *file)

{
  REF_GLOB RVar1;
  uint uVar2;
  size_t sVar3;
  double local_130;
  int local_128;
  int local_120;
  int local_11c;
  int local_118;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  char *yp_2;
  char *xp_2;
  double y_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  char *yp_1;
  char *xp_1;
  double y_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char *yp;
  char *xp;
  double y;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL node_not_used_once;
  REF_STATUS status;
  REF_INT local;
  REF_INT i;
  REF_INT n;
  REF_GLOB global;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_DBL swapped_dbl;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_38;
  REF_INT chunk;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_INT local_20;
  REF_BOOL twod_local;
  REF_INT version_local;
  REF_BOOL swap_endian_local;
  REF_NODE ref_node_local;
  
  pRStack_38 = ref_node->ref_mpi;
  ref_private_macro_code_rss = 0;
  local_11c = (int)(ref_node->old_n_global / (long)pRStack_38->n) + 1;
  if (pRStack_38->reduce_byte_limit < 1) {
    local_118 = 0x7fffffff;
  }
  else {
    local_118 = pRStack_38->reduce_byte_limit / 0x20;
  }
  if (local_118 <= local_11c) {
    if (pRStack_38->reduce_byte_limit < 1) {
      local_120 = 0x7fffffff;
    }
    else {
      local_120 = pRStack_38->reduce_byte_limit / 0x20;
    }
    local_11c = local_120;
  }
  local_xyzm._4_4_ = local_11c;
  ref_mpi = (REF_MPI)file;
  file_local._4_4_ = twod;
  local_20 = version;
  twod_local = swap_endian;
  _version_local = ref_node;
  if (local_11c * 4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x4ba,
           "ref_gather_node","malloc local_xyzm of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    xyzm = (REF_DBL *)malloc((long)(local_11c << 2) << 3);
    if (xyzm == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x4ba,"ref_gather_node","malloc local_xyzm of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else if (local_xyzm._4_4_ * 4 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x4bb,"ref_gather_node","malloc xyzm of REF_DBL negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      swapped_dbl = (REF_DBL)malloc((long)(local_xyzm._4_4_ << 2) << 3);
      if ((void *)swapped_dbl == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x4bb,"ref_gather_node","malloc xyzm of REF_DBL NULL");
        ref_node_local._4_4_ = 2;
      }
      else {
        first = 0;
        while (first < _version_local->old_n_global) {
          global = first;
          if ((long)local_xyzm._4_4_ < _version_local->old_n_global - first) {
            local_128 = local_xyzm._4_4_;
          }
          else {
            local_128 = (int)_version_local->old_n_global - (int)first;
          }
          local = local_128;
          first = local_128 + first;
          for (status = 0; status < local_xyzm._4_4_ * 4; status = status + 1) {
            xyzm[status] = 0.0;
          }
          for (status = 0; status < local; status = status + 1) {
            _i = global + status;
            uVar2 = ::ref_node_local(_version_local,_i,&node_not_used_once);
            ref_private_macro_code_rxs = uVar2;
            if ((uVar2 != 0) && (uVar2 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x4ca,"ref_gather_node",(ulong)uVar2,"node local failed");
              return uVar2;
            }
            if ((uVar2 == 0) && (pRStack_38->id == _version_local->part[node_not_used_once])) {
              xyzm[status << 2] = _version_local->real[node_not_used_once * 0xf];
              xyzm[status * 4 + 1] = _version_local->real[node_not_used_once * 0xf + 1];
              xyzm[status * 4 + 2] = _version_local->real[node_not_used_once * 0xf + 2];
              xyzm[status * 4 + 3] = 1.0;
            }
            else {
              xyzm[status << 2] = 0.0;
              xyzm[status * 4 + 1] = 0.0;
              xyzm[status * 4 + 2] = 0.0;
              xyzm[status * 4 + 3] = 0.0;
            }
          }
          uVar2 = ref_mpi_sum(pRStack_38,xyzm,(void *)swapped_dbl,local << 2,3);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x4d9,"ref_gather_node",(ulong)uVar2,"sum");
            return uVar2;
          }
          if (pRStack_38->id == 0) {
            for (status = 0; status < local; status = status + 1) {
              if (*(double *)((long)swapped_dbl + (long)(status * 4 + 3) * 8) - 1.0 <= 0.0) {
                local_130 = -(*(double *)((long)swapped_dbl + (long)(status * 4 + 3) * 8) - 1.0);
              }
              else {
                local_130 = *(double *)((long)swapped_dbl + (long)(status * 4 + 3) * 8) - 1.0;
              }
              if (0.1 < local_130) {
                printf("error gather node %ld %f\n",
                       *(undefined8 *)((long)swapped_dbl + (long)(status * 4 + 3) * 8),
                       global + status);
                ref_private_macro_code_rss = 1;
              }
              RVar1 = nnode_written;
              nnode_written = *(REF_GLOB *)((long)swapped_dbl + (long)(status << 2) * 8);
              if (twod_local != 0) {
                xp._7_1_ = (undefined1)nnode_written;
                nnode_written._1_1_ = SUB81(RVar1,1);
                xp._6_1_ = nnode_written._1_1_;
                nnode_written._2_1_ = SUB81(RVar1,2);
                xp._5_1_ = nnode_written._2_1_;
                nnode_written._3_1_ = SUB81(RVar1,3);
                xp._4_1_ = nnode_written._3_1_;
                nnode_written._4_1_ = SUB81(RVar1,4);
                xp._3_1_ = nnode_written._4_1_;
                nnode_written._5_1_ = SUB81(RVar1,5);
                xp._2_1_ = nnode_written._5_1_;
                nnode_written._6_1_ = SUB81(RVar1,6);
                xp._1_1_ = nnode_written._6_1_;
                nnode_written._7_1_ = SUB81(RVar1,7);
                xp._0_1_ = nnode_written._7_1_;
                nnode_written = (REF_GLOB)xp;
              }
              sVar3 = fwrite(&nnode_written,8,1,(FILE *)ref_mpi);
              RVar1 = nnode_written;
              if (sVar3 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x4e4,"ref_gather_node","x",1,sVar3);
                return 1;
              }
              nnode_written = *(REF_GLOB *)((long)swapped_dbl + (long)(status * 4 + 1) * 8);
              if (twod_local != 0) {
                xp_1._7_1_ = (undefined1)nnode_written;
                nnode_written._1_1_ = SUB81(RVar1,1);
                xp_1._6_1_ = nnode_written._1_1_;
                nnode_written._2_1_ = SUB81(RVar1,2);
                xp_1._5_1_ = nnode_written._2_1_;
                nnode_written._3_1_ = SUB81(RVar1,3);
                xp_1._4_1_ = nnode_written._3_1_;
                nnode_written._4_1_ = SUB81(RVar1,4);
                xp_1._3_1_ = nnode_written._4_1_;
                nnode_written._5_1_ = SUB81(RVar1,5);
                xp_1._2_1_ = nnode_written._5_1_;
                nnode_written._6_1_ = SUB81(RVar1,6);
                xp_1._1_1_ = nnode_written._6_1_;
                nnode_written._7_1_ = SUB81(RVar1,7);
                xp_1._0_1_ = nnode_written._7_1_;
                nnode_written = (REF_GLOB)xp_1;
              }
              sVar3 = fwrite(&nnode_written,8,1,(FILE *)ref_mpi);
              if (sVar3 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x4e7,"ref_gather_node","y",1,sVar3);
                return 1;
              }
              if (file_local._4_4_ == 0) {
                RVar1 = *(REF_GLOB *)((long)swapped_dbl + (long)(status * 4 + 2) * 8);
                nnode_written = RVar1;
                if (twod_local != 0) {
                  nnode_written._0_1_ = (undefined1)RVar1;
                  xp_2._7_1_ = (undefined1)nnode_written;
                  nnode_written._1_1_ = (undefined1)((ulong)RVar1 >> 8);
                  xp_2._6_1_ = nnode_written._1_1_;
                  nnode_written._2_1_ = (undefined1)((ulong)RVar1 >> 0x10);
                  xp_2._5_1_ = nnode_written._2_1_;
                  nnode_written._3_1_ = (undefined1)((ulong)RVar1 >> 0x18);
                  xp_2._4_1_ = nnode_written._3_1_;
                  nnode_written._4_1_ = (undefined1)((ulong)RVar1 >> 0x20);
                  xp_2._3_1_ = nnode_written._4_1_;
                  nnode_written._5_1_ = (undefined1)((ulong)RVar1 >> 0x28);
                  xp_2._2_1_ = nnode_written._5_1_;
                  nnode_written._6_1_ = (undefined1)((ulong)RVar1 >> 0x30);
                  xp_2._1_1_ = nnode_written._6_1_;
                  nnode_written._7_1_ = (undefined1)((ulong)RVar1 >> 0x38);
                  xp_2._0_1_ = nnode_written._7_1_;
                  nnode_written = (REF_GLOB)xp_2;
                }
                sVar3 = fwrite(&nnode_written,8,1,(FILE *)ref_mpi);
                if (sVar3 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x4eb,"ref_gather_node","z",1,sVar3);
                  return 1;
                }
              }
              if (((0 < local_20) && (local_20 < 5)) &&
                 (uVar2 = ref_gather_meshb_int((FILE *)ref_mpi,local_20,1), uVar2 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x4ef,"ref_gather_node",(ulong)uVar2,"nnode");
                return uVar2;
              }
            }
          }
        }
        if (swapped_dbl != 0.0) {
          free((void *)swapped_dbl);
        }
        if (xyzm != (REF_DBL *)0x0) {
          free(xyzm);
        }
        uVar2 = ref_mpi_all_or(pRStack_38,&ref_private_macro_code_rss);
        if (uVar2 == 0) {
          if (ref_private_macro_code_rss == 0) {
            ref_node_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x4f7,"ref_gather_node","node used more or less than once");
            ref_node_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x4f6,"ref_gather_node",(ulong)uVar2,"all gather error code");
          ref_node_local._4_4_ = uVar2;
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node(REF_NODE ref_node,
                                          REF_BOOL swap_endian, REF_INT version,
                                          REF_BOOL twod, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_DBL swapped_dbl;
  REF_GLOB nnode_written, first, global;
  REF_INT n, i;
  REF_INT local;
  REF_STATUS status;
  REF_BOOL node_not_used_once = REF_FALSE;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 4 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 4 * chunk, REF_DBL);
  ref_malloc(xyzm, 4 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 4 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        local_xyzm[0 + 4 * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + 4 * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + 4 * i] = ref_node_xyz(ref_node, 2, local);
        local_xyzm[3 + 4 * i] = 1.0;
      } else {
        local_xyzm[0 + 4 * i] = 0.0;
        local_xyzm[1 + 4 * i] = 0.0;
        local_xyzm[2 + 4 * i] = 0.0;
        local_xyzm[3 + 4 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 4 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + 4 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[3 + 4 * i]);
          node_not_used_once = REF_TRUE;
        }
        swapped_dbl = xyzm[0 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
        swapped_dbl = xyzm[1 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
        if (!twod) {
          swapped_dbl = xyzm[2 + 4 * i];
          if (swap_endian) SWAP_DBL(swapped_dbl);
          REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
        }
        if (1 <= version && version <= 4)
          RSS(ref_gather_meshb_int(file, version, REF_EXPORT_MESHB_VERTEX_ID),
              "nnode");
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  RSS(ref_mpi_all_or(ref_mpi, &node_not_used_once), "all gather error code");
  RAS(!node_not_used_once, "node used more or less than once");

  return REF_SUCCESS;
}